

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::EnsureLitbuf
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,CharCount size)

{
  uint *puVar1;
  Char *pCVar2;
  uint local_18;
  CharCount newLen;
  CharCount size_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  if (this->litbufLen - this->litbufNext < size) {
    puVar1 = max<unsigned_int>(&this->litbufLen,
                               &Parser<NullTerminatedUnicodeEncodingPolicy,true>::initLitbufSize);
    for (local_18 = *puVar1; local_18 < this->litbufNext + size; local_18 = local_18 << 1) {
    }
    pCVar2 = (Char *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     Realloc(&this->ctAllocator->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,this->litbuf,(ulong)this->litbufLen << 1,(ulong)local_18 << 1);
    this->litbuf = pCVar2;
    this->litbufLen = local_18;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::EnsureLitbuf(CharCount size)
    {
        if (litbufLen - litbufNext < size)
        {
            CharCount newLen = max(litbufLen, initLitbufSize);
            while (newLen < litbufNext + size)
                newLen *= 2;
            litbuf = (Char*)ctAllocator->Realloc(litbuf, litbufLen * sizeof(Char), newLen * sizeof(Char));
            litbufLen = newLen;
        }
    }